

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Tag_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTagDecl
          (Result<wasm::Tag_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  int __val;
  Name root;
  Name name_;
  Name name_00;
  bool bVar1;
  Tag *pTVar2;
  pointer pTVar3;
  type item;
  char *__lhs;
  Tag *local_140;
  ParseDeclsCtx *local_138;
  size_t sStack_130;
  string_view local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Name local_d8;
  ParseDeclsCtx *local_c8;
  size_t sStack_c0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  ParseDeclsCtx *local_68;
  size_t sStack_60;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_40;
  __single_object t;
  ImportNames *importNames_local;
  Index pos_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  t._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
       (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)importNames;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  std::make_unique<wasm::Tag>();
  bVar1 = IString::operator_cast_to_bool((IString *)&this_local);
  if (bVar1) {
    local_68 = this_local;
    sStack_60 = name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    pTVar2 = Module::getTagOrNull(this->wasm,name_00);
    if (pTVar2 != (Tag *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"repeated tag name",&local_a9);
      Lexer::err(&local_88,&this->in,(ulong)pos,&local_a8);
      Result<wasm::Tag_*>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_0231221f;
    }
    pTVar3 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_40);
    local_c8 = this_local;
    sStack_c0 = name_local.super_IString.str._M_len;
    name_.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_.super_IString.str._M_len = (size_t)this_local;
    Named::setExplicitName((Named *)pTVar3,name_);
  }
  else {
    __lhs = "tag$";
    if ((__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)
        t._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0) {
      __lhs = "eimport$";
    }
    __val = this->tagCounter;
    this->tagCounter = __val + 1;
    std::__cxx11::to_string(&local_118,__val);
    std::operator+(&local_f8,__lhs,&local_118);
    wasm::Name::Name(&local_d8,&local_f8);
    wasm::Name::operator=((Name *)&this_local,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_138 = this_local;
    sStack_130 = name_local.super_IString.str._M_len;
    root.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)this_local;
    local_128 = (string_view)Names::getValidTagName(this->wasm,root);
    wasm::Name::operator=((Name *)&this_local,(Name *)&local_128);
    pTVar3 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_40);
    wasm::Name::operator=((Name *)pTVar3,(Name *)&this_local);
  }
  item = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator*(&local_40);
  anon_unknown_5::applyImportNames
            (&item->super_Importable,
             (ImportNames *)
             t._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl);
  local_140 = Module::addTag(this->wasm,&local_40);
  Result<wasm::Tag*>::Result<wasm::Tag*>((Result<wasm::Tag*> *)__return_storage_ptr__,&local_140);
LAB_0231221f:
  local_b0 = 1;
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<Tag*>
ParseDeclsCtx::addTagDecl(Index pos, Name name, ImportNames* importNames) {
  auto t = std::make_unique<Tag>();
  if (name) {
    if (wasm.getTagOrNull(name)) {
      // TODO: if the existing tag is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated tag name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "eimport$" : "tag$") + std::to_string(tagCounter++);
    name = Names::getValidTagName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTag(std::move(t));
}